

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O1

void TestEq<float,float>(float expval,float val,char *exp,char *file,int line,char *func)

{
  _Alloc_hider expval_00;
  string local_68;
  string local_48;
  
  if ((expval != val) || (NAN(expval) || NAN(val))) {
    flatbuffers::FloatToString<float>(&local_48,expval,6);
    expval_00._M_p = local_48._M_dataplus._M_p;
    flatbuffers::FloatToString<float>(&local_68,val,6);
    TestFail(expval_00._M_p,local_68._M_dataplus._M_p,exp,file,line,func);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line,
            const char *func) {
  if (static_cast<U>(expval) != val) {
    TestFail(flatbuffers::NumToString(scalar_as_underlying(expval)).c_str(),
             flatbuffers::NumToString(scalar_as_underlying(val)).c_str(), exp,
             file, line, func);
  }
}